

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

void old_swap_nifti_header(nifti_1_header *h,int is_nifti)

{
  nifti_swap_4bytes(1,h);
  nifti_swap_2bytes(8,h->dim);
  nifti_swap_4bytes(8,h->pixdim);
  nifti_swap_2bytes(1,&h->datatype);
  nifti_swap_2bytes(1,&h->bitpix);
  nifti_swap_4bytes(1,&h->vox_offset);
  nifti_swap_4bytes(1,&h->cal_max);
  nifti_swap_4bytes(1,&h->cal_min);
  if (is_nifti != 0) {
    nifti_swap_4bytes(1,&h->intent_p1);
    nifti_swap_4bytes(1,&h->intent_p2);
    nifti_swap_4bytes(1,&h->intent_p3);
    nifti_swap_2bytes(1,&h->intent_code);
    nifti_swap_2bytes(1,&h->slice_start);
    nifti_swap_2bytes(1,&h->slice_end);
    nifti_swap_4bytes(1,&h->scl_slope);
    nifti_swap_4bytes(1,&h->scl_inter);
    nifti_swap_4bytes(1,&h->slice_duration);
    nifti_swap_4bytes(1,&h->toffset);
    nifti_swap_2bytes(1,&h->qform_code);
    nifti_swap_2bytes(1,&h->sform_code);
    nifti_swap_4bytes(1,&h->quatern_b);
    nifti_swap_4bytes(1,&h->quatern_c);
    nifti_swap_4bytes(1,&h->quatern_d);
    nifti_swap_4bytes(1,&h->qoffset_x);
    nifti_swap_4bytes(1,&h->qoffset_y);
    nifti_swap_4bytes(1,&h->qoffset_z);
    nifti_swap_4bytes(4,h->srow_x);
    nifti_swap_4bytes(4,h->srow_y);
    nifti_swap_4bytes(4,h->srow_z);
    return;
  }
  return;
}

Assistant:

void old_swap_nifti_header( struct nifti_1_header *h , int is_nifti )
{
   /* this stuff is always present, for ANALYZE and NIFTI */

   swap_4(h->sizeof_hdr) ;
   nifti_swap_2bytes( 8 , h->dim ) ;
   nifti_swap_4bytes( 8 , h->pixdim ) ;

   swap_2(h->datatype) ;
   swap_2(h->bitpix) ;

   swap_4(h->vox_offset); swap_4(h->cal_max); swap_4(h->cal_min);

   /* this stuff is NIFTI specific */

   if( is_nifti ){
     swap_4(h->intent_p1); swap_4(h->intent_p2); swap_4(h->intent_p3);
     swap_2(h->intent_code);

     swap_2(h->slice_start);    swap_2(h->slice_end);
     swap_4(h->scl_slope);      swap_4(h->scl_inter);
     swap_4(h->slice_duration); swap_4(h->toffset);

     swap_2(h->qform_code); swap_2(h->sform_code);
     swap_4(h->quatern_b); swap_4(h->quatern_c); swap_4(h->quatern_d);
     swap_4(h->qoffset_x); swap_4(h->qoffset_y); swap_4(h->qoffset_z);
     nifti_swap_4bytes(4,h->srow_x);
     nifti_swap_4bytes(4,h->srow_y);
     nifti_swap_4bytes(4,h->srow_z);
   }
   return ;
}